

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewChange.h
# Opt level: O0

bool __thiscall NewChangeDot::CreateDirsWithHashTitle(NewChangeDot *this)

{
  byte bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  char *pcVar5;
  Logger *pLVar6;
  Tools *this_00;
  allocator<char> local_6e1;
  string local_6e0;
  string local_6c0 [32];
  string local_6a0;
  string local_680;
  string local_660 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  allocator<char> local_5d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  long local_538;
  ofstream file;
  string local_338 [32];
  string local_318 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  allocator<char> local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_240 [32];
  int local_220;
  byte local_219;
  int i;
  bool isCreated;
  ifstream dir;
  NewChangeDot *this_local;
  
  std::ifstream::ifstream(&i);
  local_219 = 1;
  for (local_220 = 0; uVar2 = (ulong)local_220,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->
                      super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ).files), uVar2 < sVar3; local_220 = local_220 + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((this->
                  super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).hashNames,(long)local_220);
    std::__cxx11::string::substr((ulong)local_240,(ulong)pvVar4);
    std::__cxx11::string::operator=
              ((string *)
               &(this->
                super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ).shortHashName,local_240);
    std::__cxx11::string::~string(local_240);
    pcVar5 = (char *)std::__cxx11::string::data();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,pcVar5,&local_2b1);
    std::operator+(&local_290,&local_2b0,"/objects/");
    std::operator+(&local_270,&local_290,
                   &(this->
                    super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ).shortHashName);
    std::ifstream::open((string *)&i,(_Ios_Openmode)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      pLVar6 = Logger::getInstance();
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&(this->
                     super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ).files,(long)local_220);
      std::operator+(&local_2f8,"Directory ",pvVar4);
      std::operator+(&local_2d8,&local_2f8," didn\'t create");
      Logger::LogError(pLVar6,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      local_219 = 0;
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&(this->
                     super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ).files,(long)local_220);
      std::__cxx11::string::string(local_318,(string *)pvVar4);
      std::__cxx11::string::string
                (local_338,
                 (string *)
                 &(this->
                  super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).shortHashName);
      (*(this->
        super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )._vptr_NewChangeBase[2])(this,local_318,local_338);
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string(local_318);
      pcVar5 = (char *)std::__cxx11::string::data();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,pcVar5,&local_5d9);
      std::operator+(&local_5b8,&local_5d8,"/objects/");
      std::operator+(&local_598,&local_5b8,
                     &(this->
                      super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ).shortHashName);
      std::operator+(&local_578,&local_598,"/");
      std::operator+(&local_558,&local_578,
                     &(this->
                      super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ).shortHashName);
      std::ofstream::ofstream(&local_538,(string *)&local_558,_S_out);
      std::__cxx11::string::~string((string *)&local_558);
      std::__cxx11::string::~string((string *)&local_578);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string((string *)&local_5b8);
      std::__cxx11::string::~string((string *)&local_5d8);
      std::allocator<char>::~allocator(&local_5d9);
      bVar1 = std::ios::operator!((ios *)((long)&local_538 + *(long *)(local_538 + -0x18)));
      if ((bVar1 & 1) != 0) {
        pLVar6 = Logger::getInstance();
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&(this->
                       super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ).files,(long)local_220);
        std::operator+(&local_640,"file ",pvVar4);
        std::operator+(&local_620,&local_640," didn\'t add in ");
        std::operator+(&local_600,&local_620,
                       &(this->
                        super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ).shortHashName);
        Logger::LogError(pLVar6,&local_600);
        std::__cxx11::string::~string((string *)&local_600);
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::~string((string *)&local_640);
      }
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((this->
                    super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ).hashNames,(long)local_220);
      std::operator<<((ostream *)&local_538,(string *)pvVar4);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&(this->
                     super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ).files,(long)local_220);
      std::__cxx11::string::string(local_660,(string *)pvVar4);
      this_00 = Tools::getInstance();
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&(this->
                     super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ).files,(long)local_220);
      std::__cxx11::string::string((string *)&local_6a0,(string *)pvVar4);
      Tools::GetFileString(&local_680,this_00,&local_6a0);
      std::__cxx11::string::string
                (local_6c0,
                 (string *)
                 &(this->
                  super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).shortHashName);
      (*(this->
        super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )._vptr_NewChangeBase[3])(this,local_660,&local_680,local_6c0);
      std::__cxx11::string::~string(local_6c0);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::__cxx11::string::~string(local_660);
      std::ofstream::~ofstream(&local_538);
    }
  }
  if ((local_219 & 1) != 0) {
    pLVar6 = Logger::getInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6e0,"Directory created successfully",&local_6e1);
    Logger::LogInformation(pLVar6,&local_6e0);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::allocator<char>::~allocator(&local_6e1);
  }
  std::ifstream::close();
  bVar1 = local_219;
  std::ifstream::~ifstream(&i);
  return (bool)(bVar1 & 1);
}

Assistant:

virtual bool CreateDirsWithHashTitle() override {
        ifstream dir;
        bool isCreated = true;

        for (int i = 0; i < this->files.size(); i++) {
            this->shortHashName = this->hashNames->at(i).substr(0, 6);
            dir.open(string(this->path->data()) + "/objects/" + this->shortHashName);
            if (!dir.is_open()) {
                Logger::getInstance()->LogError(
                        "Directory " + this->files.at(i) + " didn't create");
                isCreated = false;
            } else {
                WriteInIndexFile(this->files.at(i), this->shortHashName);
                ofstream file(string(this->path->data()) + "/objects/" + this->shortHashName + "/" +
                              this->shortHashName);
                if (!file) {
                    Logger::getInstance()->LogError(
                            "file " + this->files.at(i) + " didn't add in " + this->shortHashName);
                }
                file << this->hashNames->at(i);
                AddOldVersion(this->files.at(i), Tools::getInstance()->GetFileString(this->files.at(i)),
                              this->shortHashName);
            }
        }

        if (isCreated) {
            Logger::getInstance()->LogInformation("Directory created successfully");
        }

        dir.close();

        return isCreated;
    }